

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

void __thiscall wasm::BinaryInstWriter::visitCallIndirect(BinaryInstWriter *this,CallIndirect *curr)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uint32_t uVar1;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  int __fd;
  LEB<unsigned_int,_unsigned_char> local_34;
  LEB<unsigned_int,_unsigned_char> local_30;
  byte local_29;
  
  uVar1 = WasmBinaryWriter::getTableIndex(this->parent,(Name)(curr->table).super_IString.str);
  local_29 = curr->isReturn * '\x02' | 0x11;
  this_00 = &this->o->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
            (this_00,&local_29);
  local_30.value = WasmBinaryWriter::getTypeIndex(this->parent,(HeapType)(curr->heapType).id);
  __fd = (int)this_00;
  LEB<unsigned_int,_unsigned_char>::write(&local_30,__fd,__buf,in_RCX);
  local_34.value = uVar1;
  LEB<unsigned_int,_unsigned_char>::write(&local_34,__fd,__buf_00,in_RCX);
  return;
}

Assistant:

void BinaryInstWriter::visitCallIndirect(CallIndirect* curr) {
  Index tableIdx = parent.getTableIndex(curr->table);
  int8_t op =
    curr->isReturn ? BinaryConsts::RetCallIndirect : BinaryConsts::CallIndirect;
  o << op << U32LEB(parent.getTypeIndex(curr->heapType)) << U32LEB(tableIdx);
}